

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O2

IGUIImageList * __thiscall
irr::gui::CGUIEnvironment::createImageList
          (CGUIEnvironment *this,ITexture *texture,dimension2d<int> imageSize,bool useAlphaChannel)

{
  bool bVar1;
  CGUIImageList *this_00;
  
  this_00 = (CGUIImageList *)operator_new(0x48);
  CGUIImageList::CGUIImageList(this_00,this->Driver);
  bVar1 = CGUIImageList::createImageList(this_00,texture,imageSize,useAlphaChannel);
  if (!bVar1) {
    IReferenceCounted::drop
              ((IReferenceCounted *)
               ((long)&(this_00->super_IGUIImageList)._vptr_IGUIImageList +
               (long)(this_00->super_IGUIImageList)._vptr_IGUIImageList[-3]));
    this_00 = (CGUIImageList *)0x0;
  }
  return &this_00->super_IGUIImageList;
}

Assistant:

IGUIImageList *CGUIEnvironment::createImageList(video::ITexture *texture,
		core::dimension2d<s32> imageSize, bool useAlphaChannel)
{
	CGUIImageList *imageList = new CGUIImageList(Driver);
	if (!imageList->createImageList(texture, imageSize, useAlphaChannel)) {
		imageList->drop();
		return 0;
	}

	return imageList;
}